

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::internal_node<int,_true>_> *
immutable::rrb_details::copy_first_k<int,true,5>
          (ref<immutable::rrb<int,_true,_5>_> *in,ref<immutable::rrb<int,_true,_5>_> *new_rrb,
          uint32_t k,uint32_t tail_size)

{
  atomic<unsigned_int> *paVar1;
  rrb<int,_true,_5> *prVar2;
  rrb_size_table<true> *prVar3;
  uint32_t *puVar4;
  ref<immutable::rrb_details::internal_node<int,_true>_> rVar5;
  internal_node<int,_true> *piVar6;
  rrb_size_table<true> *__ptr;
  char *__function;
  uint uVar7;
  long lVar8;
  ref<immutable::rrb_details::tree_node<int,_true>_> *this;
  ulong uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_current;
  ref<immutable::rrb_details::internal_node<int,_true>_> current;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_60;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_58;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_50;
  uint local_44;
  uint32_t local_40;
  uint32_t local_3c;
  ref<immutable::rrb_details::tree_node<int,_true>_> *local_38;
  
  local_40 = tail_size;
  if (in->ptr != (rrb<int,_true,_5> *)0x0) {
    local_58.ptr = (internal_node<int,_true> *)(in->ptr->root).ptr;
    if (local_58.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((local_58.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((local_58.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    if ((new_rrb->ptr != (rrb<int,_true,_5> *)0x0) &&
       (prVar2 = in->ptr, prVar2 != (rrb<int,_true,_5> *)0x0)) {
      this = &new_rrb->ptr->root;
      uVar10 = prVar2->shift;
      if (uVar10 != 0 && k != 0) {
        local_44 = prVar2->cnt - 1;
        uVar11 = 1;
        do {
          rVar5.ptr = local_58.ptr;
          local_60.ptr = (internal_node<int,_true> *)0x0;
          if (uVar11 != k) {
            uVar7 = (local_58.ptr)->len;
            local_3c = uVar10;
            local_38 = this;
            piVar6 = (internal_node<int,_true> *)malloc((ulong)uVar7 * 8 + 0x20);
            piVar6->len = uVar7;
            piVar6->type = INTERNAL_NODE;
            (piVar6->size_table).ptr = (rrb_size_table<true> *)0x0;
            ref<immutable::rrb_details::rrb_size_table<true>_>::operator=
                      (&piVar6->size_table,&(rVar5.ptr)->size_table);
            piVar6->guid = 0;
            piVar6->child = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(piVar6 + 1);
            uVar7 = (rVar5.ptr)->len;
            memset(piVar6 + 1,0,(ulong)uVar7 * 8);
            if ((ulong)uVar7 != 0) {
              lVar8 = 0;
              uVar9 = 0;
              do {
                ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                          ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                           ((long)&piVar6->child->ptr + lVar8),
                           (ref<immutable::rrb_details::internal_node<int,_true>_> *)
                           ((long)&(rVar5.ptr)->child->ptr + lVar8));
                uVar9 = uVar9 + 1;
                lVar8 = lVar8 + 8;
              } while (uVar9 < (rVar5.ptr)->len);
            }
            LOCK();
            (piVar6->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
            UNLOCK();
            local_50.ptr = piVar6;
            ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(&local_60,&local_50);
            release<int>(local_50.ptr);
            uVar10 = local_3c;
            if (local_58.ptr != (internal_node<int,_true> *)0x0) {
              this = local_38;
              if (((local_58.ptr)->size_table).ptr == (rrb_size_table<true> *)0x0)
              goto LAB_00119652;
              if (local_60.ptr != (internal_node<int,_true> *)0x0) {
                prVar3 = ((local_60.ptr)->size_table).ptr;
                uVar7 = (local_60.ptr)->len;
                __ptr = (rrb_size_table<true> *)malloc((ulong)uVar7 * 4 + 0x10);
                __ptr->size = (uint32_t *)(__ptr + 1);
                memcpy(__ptr + 1,prVar3->size,(ulong)uVar7 << 2);
                __ptr->guid = 0;
                LOCK();
                (__ptr->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
                UNLOCK();
                if (local_60.ptr != (internal_node<int,_true> *)0x0) {
                  LOCK();
                  (__ptr->_ref_count).super___atomic_base<unsigned_int>._M_i =
                       (__ptr->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
                  UNLOCK();
                  prVar3 = ((local_60.ptr)->size_table).ptr;
                  ((local_60.ptr)->size_table).ptr = __ptr;
                  if (prVar3 != (rrb_size_table<true> *)0x0) {
                    LOCK();
                    paVar1 = &prVar3->_ref_count;
                    (paVar1->super___atomic_base<unsigned_int>)._M_i =
                         (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
                    UNLOCK();
                    if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
                      free(prVar3);
                    }
                  }
                  LOCK();
                  paVar1 = &__ptr->_ref_count;
                  (paVar1->super___atomic_base<unsigned_int>)._M_i =
                       (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
                  UNLOCK();
                  if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
                    free(__ptr);
                  }
                  if (local_60.ptr != (internal_node<int,_true> *)0x0) {
                    prVar3 = ((local_60.ptr)->size_table).ptr;
                    if (prVar3 == (rrb_size_table<true> *)0x0) goto LAB_0011972f;
                    puVar4 = prVar3->size + ((local_60.ptr)->len - 1);
                    *puVar4 = *puVar4 + local_40;
                    this = local_38;
                    goto LAB_00119652;
                  }
                }
              }
            }
LAB_00119710:
            __function = 
            "T *immutable::ref<immutable::rrb_details::internal_node<int, true>>::operator->() const [T = immutable::rrb_details::internal_node<int, true>]"
            ;
            goto LAB_00119725;
          }
          local_50.ptr = internal_node_inc<int,true>(local_58.ptr);
          if (local_50.ptr != (internal_node<int,_true> *)0x0) {
            LOCK();
            ((local_50.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
            UNLOCK();
          }
          ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(&local_60,&local_50);
          release<int>(local_50.ptr);
          if (local_58.ptr == (internal_node<int,_true> *)0x0) goto LAB_00119710;
          if (((local_58.ptr)->size_table).ptr != (rrb_size_table<true> *)0x0) {
            if (local_60.ptr == (internal_node<int,_true> *)0x0) goto LAB_00119710;
            prVar3 = ((local_60.ptr)->size_table).ptr;
            if (prVar3 == (rrb_size_table<true> *)0x0) {
LAB_0011972f:
              __function = 
              "T *immutable::ref<immutable::rrb_details::rrb_size_table<true>>::operator->() const [T = immutable::rrb_details::rrb_size_table<true>]"
              ;
              goto LAB_00119725;
            }
            puVar4 = prVar3->size;
            puVar4[(local_60.ptr)->len - 1] = puVar4[(local_60.ptr)->len - 2] + local_40;
          }
LAB_00119652:
          ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this,&local_60);
          if (local_58.ptr == (internal_node<int,_true> *)0x0) goto LAB_00119710;
          prVar3 = ((local_58.ptr)->size_table).ptr;
          if (prVar3 == (rrb_size_table<true> *)0x0) {
            uVar7 = local_44 >> ((byte)uVar10 & 0x1f) & 0x1f;
          }
          else {
            if (local_60.ptr == (internal_node<int,_true> *)0x0) goto LAB_00119710;
            uVar7 = (local_60.ptr)->len - 1;
            if (uVar7 == 0) {
              uVar7 = 0;
            }
            else {
              local_44 = local_44 - prVar3->size[(local_60.ptr)->len - 2];
            }
          }
          if (local_60.ptr == (internal_node<int,_true> *)0x0) goto LAB_00119710;
          this = (ref<immutable::rrb_details::tree_node<int,_true>_> *)
                 ((local_60.ptr)->child + uVar7);
          if (uVar7 < (local_58.ptr)->len) {
            ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                      (&local_58,(local_58.ptr)->child + uVar7);
          }
          release<int>(local_60.ptr);
          uVar11 = uVar11 + 1;
        } while ((uVar11 <= k) && (uVar10 = uVar10 - 5, uVar10 != 0));
      }
      release<int>(local_58.ptr);
      return (ref<immutable::rrb_details::internal_node<int,_true>_> *)this;
    }
  }
  __function = 
  "T *immutable::ref<immutable::rrb<int>>::operator->() const [T = immutable::rrb<int>]";
LAB_00119725:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* copy_first_k(const ref<rrb<T, atomic_ref_counting, N>>& in, const ref<rrb<T, atomic_ref_counting, N>>& new_rrb, const uint32_t k, const uint32_t tail_size)
      {
      ref<internal_node<T, atomic_ref_counting>> current = in->root;
      ref<internal_node<T, atomic_ref_counting>>* to_set = (ref<internal_node<T, atomic_ref_counting>>*)&new_rrb->root;
      uint32_t index = in->cnt - 1;
      uint32_t shift = in->shift;

      // Copy all non-leaf nodes first. Happens when shift > RRB_BRANCHING
      uint32_t i = 1;
      while (i <= k && shift != 0)
        {
        // First off, copy current node and stick it in.
        ref<internal_node<T, atomic_ref_counting>> new_current;
        if (i != k)
          {
          new_current = internal_node_clone(current.ptr);
          if (current->size_table.ptr != nullptr)
            {
            new_current->size_table = size_table_clone(new_current->size_table.ptr, new_current->len);
            new_current->size_table->size[new_current->len - 1] += tail_size;
            }
          }
        else
          { // increment size of last element -- will only happen if we append empties
          new_current = internal_node_inc(current.ptr);
          if (current->size_table.ptr != nullptr)
            {
            new_current->size_table->size[new_current->len - 1] = new_current->size_table->size[new_current->len - 2] + tail_size;
            }
          }
        *to_set = new_current;

        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          child_index = (index >> shift) & bits<N>::rrb_mask;
          }
        else
          {
          // no need for sized_pos here, luckily.
          child_index = new_current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        to_set = &new_current->child[child_index];
        if (child_index < current->len)
          current = current->child[child_index];

        i++;
        shift -= bits<N>::rrb_bits;
        }
      return to_set;
      }